

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

string * deqp::gles31::Functional::anon_unknown_1::UserDefinedIOCase::glslCheckBasicTypeObject
                   (string *__return_storage_ptr__,string *name,DataType type,int indentationDepth)

{
  int iVar1;
  long *plVar2;
  long *plVar3;
  ulong *puVar4;
  size_type *psVar5;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 extraout_RDX_11;
  undefined8 uVar6;
  int iVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string indentation;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  string *local_e8;
  string local_e0;
  ulong *local_c0;
  long local_b8;
  ulong local_b0;
  long lStack_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  DataType local_5c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar1 = glu::getDataTypeScalarSize(type);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)indentationDepth);
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_e8 = __return_storage_ptr__;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,local_50._M_dataplus._M_p,
             local_50._M_dataplus._M_p + local_50._M_string_length);
  std::__cxx11::string::append((char *)&local_a0);
  glu::getDataTypeName(type);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_a0);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_70 = *plVar3;
    lStack_68 = plVar2[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar3;
    local_80 = (long *)*plVar2;
  }
  local_78 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_80);
  puVar4 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar4) {
    local_b0 = *puVar4;
    lStack_a8 = plVar2[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *puVar4;
    local_c0 = (ulong *)*plVar2;
  }
  local_b8 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_c0,(ulong)(name->_M_dataplus)._M_p);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  psVar5 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_e0.field_2._M_allocated_capacity = *psVar5;
    local_e0.field_2._8_8_ = plVar2[3];
  }
  else {
    local_e0.field_2._M_allocated_capacity = *psVar5;
    local_e0._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_e0._M_string_length = plVar2[1];
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_e0);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_f8 = *plVar3;
    lStack_f0 = plVar2[3];
    local_108 = &local_f8;
  }
  else {
    local_f8 = *plVar3;
    local_108 = (long *)*plVar2;
  }
  local_100 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_e8,(ulong)local_108);
  uVar6 = extraout_RDX;
  if (local_108 != &local_f8) {
    operator_delete(local_108,local_f8 + 1);
    uVar6 = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    uVar6 = extraout_RDX_01;
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
    uVar6 = extraout_RDX_02;
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,local_70 + 1);
    uVar6 = extraout_RDX_03;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    uVar6 = extraout_RDX_04;
  }
  if (type != TYPE_FLOAT) {
    local_b8 = 0;
    local_b0 = local_b0 & 0xffffffffffffff00;
    local_c0 = &local_b0;
    glu::getDataTypeName(type);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_c0);
    psVar5 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_e0.field_2._M_allocated_capacity = *psVar5;
      local_e0.field_2._8_8_ = plVar2[3];
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    }
    else {
      local_e0.field_2._M_allocated_capacity = *psVar5;
      local_e0._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_e0._M_string_length = plVar2[1];
    *plVar2 = (long)psVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_e0);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_f8 = *plVar3;
      lStack_f0 = plVar2[3];
      local_108 = &local_f8;
    }
    else {
      local_f8 = *plVar3;
      local_108 = (long *)*plVar2;
    }
    local_100 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_e8,(ulong)local_108);
    uVar6 = extraout_RDX_05;
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
      uVar6 = extraout_RDX_06;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      uVar6 = extraout_RDX_07;
    }
    if (local_c0 != &local_b0) {
      operator_delete(local_c0,local_b0 + 1);
      uVar6 = extraout_RDX_08;
    }
  }
  local_5c = type;
  if (0 < iVar1) {
    iVar7 = 0;
    do {
      if (iVar7 == 0) {
        local_108 = &local_f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"v","");
      }
      else {
        de::floatToString_abi_cxx11_(&local_e0,(de *)&DAT_00000001,(float)iVar7 * 0.8,(int)uVar6);
        plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,0x1c4bbf9);
        plVar3 = plVar2 + 2;
        if ((long *)*plVar2 == plVar3) {
          local_f8 = *plVar3;
          lStack_f0 = plVar2[3];
          local_108 = &local_f8;
        }
        else {
          local_f8 = *plVar3;
          local_108 = (long *)*plVar2;
        }
        local_100 = plVar2[1];
        *plVar2 = (long)plVar3;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
      }
      std::__cxx11::string::_M_append((char *)local_e8,(ulong)local_108);
      uVar6 = extraout_RDX_09;
      if (local_108 != &local_f8) {
        operator_delete(local_108,local_f8 + 1);
        uVar6 = extraout_RDX_10;
      }
      if ((iVar7 != 0) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2)) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        uVar6 = extraout_RDX_11;
      }
      iVar7 = iVar7 + 1;
    } while (iVar1 != iVar7);
  }
  if (local_5c != TYPE_FLOAT) {
    std::__cxx11::string::append((char *)local_e8);
  }
  std::operator+(&local_a0,");\n",&local_50);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_a0);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_70 = *plVar3;
    lStack_68 = plVar2[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar3;
    local_80 = (long *)*plVar2;
  }
  local_78 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_80,(ulong)local_50._M_dataplus._M_p);
  puVar4 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar4) {
    local_b0 = *puVar4;
    lStack_a8 = plVar2[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *puVar4;
    local_c0 = (ulong *)*plVar2;
  }
  local_b8 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_c0);
  local_108 = &local_f8;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_f8 = *plVar3;
    lStack_f0 = plVar2[3];
  }
  else {
    local_f8 = *plVar3;
    local_108 = (long *)*plVar2;
  }
  local_100 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_e8,(ulong)local_108);
  if (local_108 != &local_f8) {
    operator_delete(local_108,local_f8 + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,local_70 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return local_e8;
}

Assistant:

string UserDefinedIOCase::glslCheckBasicTypeObject (const string& name, glu::DataType type, int indentationDepth)
{
	const int		scalarSize		= glu::getDataTypeScalarSize(type);
	const string	indentation		= string(indentationDepth, '\t');
	string			result;

	result += indentation + "allOk = allOk && compare_" + glu::getDataTypeName(type) + "(" + name + ", ";

	if (type != glu::TYPE_FLOAT)
		result += string() + glu::getDataTypeName(type) + "(";
	for (int i = 0; i < scalarSize; i++)
		result += (i > 0 ? ", v+" + de::floatToString(0.8f*(float)i, 1)
						 : "v");
	if (type != glu::TYPE_FLOAT)
		result += ")";
	result += ");\n" +
			  indentation + "v += 0.4;\n" +
			  indentation + "if (allOk) firstFailedInputIndex++;\n";

	return result;
}